

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O1

void increment_simple_rowgroup_ctr(j_decompress_ptr cinfo,JDIMENSION rows)

{
  int *piVar1;
  jpeg_decomp_master *pjVar2;
  jpeg_color_deconverter *pjVar3;
  jpeg_color_quantizer *pjVar4;
  uint num_lines;
  _func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *p_Var5;
  boolean *scanlines;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var6;
  undefined1 uStack_31;
  undefined1 *puStack_30;
  
  if ((*(int *)((long)&cinfo->master[1].prepare_for_output_pass + 4) != 0) &&
     (cinfo->max_v_samp_factor == 2)) {
    pjVar2 = cinfo->master;
    puStack_30 = &uStack_31;
    uStack_31 = 0;
    pjVar3 = cinfo->cconvert;
    if ((pjVar3 == (jpeg_color_deconverter *)0x0) ||
       (p_Var6 = pjVar3->color_convert,
       p_Var6 == (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0)) {
      scanlines = (boolean *)0x0;
      p_Var6 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0;
    }
    else {
      pjVar3->color_convert = noop_convert;
      scanlines = (boolean *)&puStack_30;
    }
    pjVar4 = cinfo->cquantize;
    if ((pjVar4 == (jpeg_color_quantizer *)0x0) ||
       (p_Var5 = pjVar4->color_quantize,
       p_Var5 == (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0)) {
      p_Var5 = (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0;
    }
    else {
      pjVar4->color_quantize = noop_quantize;
    }
    if ((*(int *)((long)&pjVar2[1].prepare_for_output_pass + 4) != 0) &&
       (cinfo->max_v_samp_factor == 2)) {
      scanlines = &cinfo->upsample[2].need_context_rows;
    }
    if (rows != 0) {
      do {
        jpeg_read_scanlines(cinfo,(JSAMPARRAY)scanlines,1);
        rows = rows - 1;
      } while (rows != 0);
    }
    if (p_Var6 != (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *)0x0) {
      cinfo->cconvert->color_convert = p_Var6;
    }
    if (p_Var5 != (_func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *)0x0) {
      cinfo->cquantize->color_quantize = p_Var5;
    }
    return;
  }
  num_lines = rows % (uint)cinfo->max_v_samp_factor;
  piVar1 = (int *)((long)&cinfo->main[6].start_pass + 4);
  *piVar1 = *piVar1 + rows / (uint)cinfo->max_v_samp_factor;
  cinfo->output_scanline = cinfo->output_scanline + (rows - num_lines);
  read_and_discard_scanlines(cinfo,num_lines);
  return;
}

Assistant:

LOCAL(void)
increment_simple_rowgroup_ctr(j_decompress_ptr cinfo, JDIMENSION rows)
{
  JDIMENSION rows_left;
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  my_master_ptr master = (my_master_ptr)cinfo->master;

  if (master->using_merged_upsample && cinfo->max_v_samp_factor == 2) {
    read_and_discard_scanlines(cinfo, rows);
    return;
  }

  /* Increment the counter to the next row group after the skipped rows. */
  main_ptr->rowgroup_ctr += rows / cinfo->max_v_samp_factor;

  /* Partially skipping a row group would involve modifying the internal state
   * of the upsampler, so read the remaining rows into a dummy buffer instead.
   */
  rows_left = rows % cinfo->max_v_samp_factor;
  cinfo->output_scanline += rows - rows_left;

  read_and_discard_scanlines(cinfo, rows_left);
}